

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

QAction * __thiscall QLineEdit::addAction(QLineEdit *this,QIcon *icon,ActionPosition position)

{
  QAction *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAction *)operator_new(0x10);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  QAction::QAction(this_00,icon,(QString *)&local_48,(QObject *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  addAction(this,this_00,position);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QLineEdit::addAction(const QIcon &icon, ActionPosition position)
{
    QAction *result = new QAction(icon, QString(), this);
    addAction(result, position);
    return result;
}